

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O3

sat_solver * IPdr_ManSetSolver(Pdr_Man_t *p,int k,int fSetPropOutput)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  sat_solver *psVar5;
  void **ppvVar6;
  Vec_Vec_t *pVVar7;
  long lVar8;
  ulong uVar9;
  
  if (p->vSolvers->nSize != k) {
    __assert_fail("Vec_PtrSize(p->vSolvers) == k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                  ,0xdf,"sat_solver *IPdr_ManSetSolver(Pdr_Man_t *, int, int)");
  }
  if (p->vActVars->nSize == k) {
    psVar5 = zsat_solver_new_seed((double)p->pPars->nRandomSeed);
    psVar5 = Pdr_ManNewSolver(psVar5,p,k,(uint)(k == 0));
    pVVar3 = p->vSolvers;
    uVar1 = pVVar3->nSize;
    if (uVar1 == pVVar3->nCap) {
      if ((int)uVar1 < 0x10) {
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc(0x80);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar3->pArray,0x80);
        }
        pVVar3->pArray = ppvVar6;
        pVVar3->nCap = 0x10;
      }
      else {
        if (pVVar3->pArray == (void **)0x0) {
          ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar6 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
        }
        pVVar3->pArray = ppvVar6;
        pVVar3->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar6 = pVVar3->pArray;
    }
    iVar2 = pVVar3->nSize;
    pVVar3->nSize = iVar2 + 1;
    ppvVar6[iVar2] = psVar5;
    Vec_IntPush(p->vActVars,0);
    if (fSetPropOutput != 0) {
      Pdr_ManSetPropertyOutput(p,k);
    }
    if ((k != 0) && (pVVar7 = p->vClauses, k < pVVar7->nSize)) {
      uVar9 = (ulong)(uint)k;
      do {
        if (k < 0) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                        ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
        }
        pvVar4 = pVVar7->pArray[uVar9];
        if (0 < *(int *)((long)pvVar4 + 4)) {
          lVar8 = 0;
          do {
            Pdr_ManSolverAddClause(p,k,*(Pdr_Set_t **)(*(long *)((long)pvVar4 + 8) + lVar8 * 8));
            lVar8 = lVar8 + 1;
          } while (lVar8 < *(int *)((long)pvVar4 + 4));
          pVVar7 = p->vClauses;
        }
        uVar9 = uVar9 + 1;
      } while ((int)uVar9 < pVVar7->nSize);
    }
    return psVar5;
  }
  __assert_fail("Vec_IntSize(p->vActVars) == k",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrIncr.c"
                ,0xe0,"sat_solver *IPdr_ManSetSolver(Pdr_Man_t *, int, int)");
}

Assistant:

sat_solver * IPdr_ManSetSolver( Pdr_Man_t * p, int k, int fSetPropOutput )
{
    sat_solver * pSat;
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, j;

    assert( Vec_PtrSize(p->vSolvers) == k );
    assert( Vec_IntSize(p->vActVars) == k );

    pSat = zsat_solver_new_seed(p->pPars->nRandomSeed);
    pSat = Pdr_ManNewSolver( pSat, p, k, (int)(k == 0) );
    Vec_PtrPush( p->vSolvers, pSat );
    Vec_IntPush( p->vActVars, 0 );

    // set the property output
    if ( fSetPropOutput )
        Pdr_ManSetPropertyOutput( p, k );

    if (k == 0)
        return pSat;

    // add the clauses
    Vec_VecForEachLevelStart( p->vClauses, vArrayK, i, k )
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, j )
            Pdr_ManSolverAddClause( p, k, pCube );
    return pSat;
}